

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O2

void ex_sum(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  t_symbol *s;
  int iVar1;
  _garray *x;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  float fVar5;
  int size;
  t_word *wvec;
  uint local_1c;
  t_word *local_18;
  
  if (argv->ex_type == 7) {
    s = (t_symbol *)(argv->ex_cont).v_vec;
    if (s == (t_symbol *)0x0) {
      optr->ex_type = 2;
      (optr->ex_cont).v_int = 0;
      pcVar4 = "(null)";
    }
    else {
      x = (_garray *)pd_findbyclass(s,garray_class);
      if ((x != (_garray *)0x0) &&
         (iVar1 = garray_getfloatwords(x,(int *)&local_1c,&local_18), iVar1 != 0)) {
        uVar3 = 0;
        uVar2 = (ulong)local_1c;
        if ((int)local_1c < 1) {
          uVar2 = uVar3;
        }
        fVar5 = 0.0;
        for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
          fVar5 = fVar5 + local_18[uVar3].w_float;
        }
        optr->ex_type = 2;
        (optr->ex_cont).v_flt = fVar5;
        return;
      }
      optr->ex_type = 2;
      (optr->ex_cont).v_int = 0;
      pcVar4 = s->s_name;
    }
    pd_error((void *)0x0,"no such table \'%s\'",pcVar4);
  }
  else {
    post("expr: sum: need a table name\n");
    optr->ex_type = 1;
    (optr->ex_cont).v_int = 0;
  }
  return;
}

Assistant:

void
ex_sum(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        t_symbol *s;
        t_garray *garray;
        int size;
        t_word *wvec;
        t_float sum;
        int indx;

        if (argv->ex_type != ET_SYM)
        {
                post("expr: sum: need a table name\n");
                optr->ex_type = ET_INT;
                optr->ex_int = 0;
                return;
        }

        s = (fts_symbol_t ) argv->ex_ptr;

        ISTABLE(s, garray, size, wvec);

        for (indx = 0, sum = 0; indx < size; indx++)
                sum += wvec[indx].w_float;

        optr->ex_type = ET_FLT;
        optr->ex_flt = sum;
}